

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int num_coeffs(aom_noise_model_params_t params)

{
  int iVar1;
  int n;
  aom_noise_model_params_t params_local;
  undefined4 local_4;
  
  params_local.lag = params.lag;
  iVar1 = params_local.lag * 2 + 1;
  params_local.shape = params.shape;
  if (params_local.shape == '\0') {
    local_4 = params_local.lag * (params_local.lag + 1);
  }
  else if (params_local.shape == '\x01') {
    local_4 = (iVar1 * iVar1) / 2;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int num_coeffs(const aom_noise_model_params_t params) {
  const int n = 2 * params.lag + 1;
  switch (params.shape) {
    case AOM_NOISE_SHAPE_DIAMOND: return params.lag * (params.lag + 1);
    case AOM_NOISE_SHAPE_SQUARE: return (n * n) / 2;
  }
  return 0;
}